

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnExport
          (SharedValidator *this,Location *loc,ExternalKind kind,Var *item_var,string_view name)

{
  Result RVar1;
  iterator iVar2;
  char *pcVar3;
  int __c;
  Enum EVar4;
  Var *pVVar5;
  string name_str;
  uint local_1cc;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  key_type local_1b8;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  local_1c8._M_str = name._M_str;
  local_1c8._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_1b8,&local_1c8,(allocator<char> *)&local_1cc);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->export_names_)._M_t,&local_1b8);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->export_names_)._M_t._M_impl.super__Rb_tree_header)
  {
    EVar4 = Ok;
  }
  else {
    RVar1 = PrintError(this,loc,"duplicate export \"%.*s\"",local_1c8._M_len & 0xffffffff,
                       local_1c8._M_str);
    EVar4 = (Enum)(RVar1.enum_ == Error);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->export_names_,&local_1b8);
  switch(kind) {
  case First:
    Var::Var(&local_78,item_var);
    pVVar5 = &local_78;
    RVar1 = CheckFuncIndex(this,&local_78,(FuncType *)0x0);
    EVar4 = (Enum)(byte)(RVar1.enum_ == Error | (byte)EVar4);
    Var::~Var(&local_78);
    pcVar3 = Var::index(item_var,(char *)pVVar5,__c);
    local_1cc = (uint)pcVar3;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_insert_unique<unsigned_int>(&(this->declared_funcs_)._M_t,&local_1cc);
    goto switchD_0013a913_default;
  case Table:
    pVVar5 = &local_c0;
    Var::Var(pVVar5,item_var);
    RVar1 = CheckTableIndex(this,pVVar5,(TableType *)0x0);
    break;
  case Memory:
    pVVar5 = &local_108;
    Var::Var(pVVar5,item_var);
    RVar1 = CheckMemoryIndex(this,pVVar5,(MemoryType *)0x0);
    break;
  case Global:
    pVVar5 = &local_150;
    Var::Var(pVVar5,item_var);
    RVar1 = CheckGlobalIndex(this,pVVar5,(GlobalType *)0x0);
    break;
  case Last:
    pVVar5 = &local_198;
    Var::Var(pVVar5,item_var);
    RVar1 = CheckTagIndex(this,pVVar5,(TagType *)0x0);
    break;
  default:
    goto switchD_0013a913_default;
  }
  EVar4 = (Enum)(byte)(RVar1.enum_ == Error | (byte)EVar4);
  Var::~Var(pVVar5);
switchD_0013a913_default:
  std::__cxx11::string::_M_dispose();
  return (Result)EVar4;
}

Assistant:

Result SharedValidator::OnExport(const Location& loc,
                                 ExternalKind kind,
                                 Var item_var,
                                 std::string_view name) {
  Result result = Result::Ok;
  auto name_str = std::string(name);
  if (export_names_.find(name_str) != export_names_.end()) {
    result |= PrintError(loc, "duplicate export \"" PRIstringview "\"",
                         WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  export_names_.insert(name_str);

  switch (kind) {
    case ExternalKind::Func:
      result |= CheckFuncIndex(item_var);
      declared_funcs_.insert(item_var.index());
      break;

    case ExternalKind::Table:
      result |= CheckTableIndex(item_var);
      break;

    case ExternalKind::Memory:
      result |= CheckMemoryIndex(item_var);
      break;

    case ExternalKind::Global:
      result |= CheckGlobalIndex(item_var);
      break;

    case ExternalKind::Tag:
      result |= CheckTagIndex(item_var);
      break;
  }
  return result;
}